

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::decode_run_pixels(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
                    *this,pixel_type ra,pixel_type *start_pos,int32_t pixel_count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  uVar6 = 0;
  do {
    bVar1 = decoder_strategy::read_bit(&this->super_decoder_strategy);
    if (!bVar1) break;
    iVar2 = this->run_index_;
    iVar5 = 1 << (J[(long)iVar2 * 4] & 0x1f);
    iVar3 = pixel_count - uVar6;
    iVar7 = iVar5;
    if (iVar3 < iVar5) {
      iVar7 = iVar3;
    }
    uVar6 = uVar6 + iVar7;
    if (pixel_count < (int)uVar6) goto LAB_00115fc8;
    if (iVar5 <= iVar3) {
      if (0x1d < iVar2) {
        iVar2 = 0x1e;
      }
      this->run_index_ = iVar2 + 1;
    }
  } while (uVar6 != pixel_count);
  if (uVar6 != pixel_count) {
    if (*(int32_t *)(J + (long)this->run_index_ * 4) < 1) {
      iVar2 = 0;
    }
    else {
      iVar2 = decoder_strategy::read_value
                        (&this->super_decoder_strategy,*(int32_t *)(J + (long)this->run_index_ * 4))
      ;
    }
    uVar6 = uVar6 + iVar2;
  }
  if ((int)uVar6 <= pixel_count) {
    if (0 < (int)uVar6) {
      lVar4 = 0;
      do {
        *(int *)((long)&start_pos->field_0 + lVar4) = ra._0_4_;
        ((anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *)
        ((long)&start_pos->field_2 + lVar4))->v3 = (unsigned_short)ra.field_2;
        lVar4 = lVar4 + 6;
      } while ((ulong)uVar6 * 6 != lVar4);
    }
    return uVar6;
  }
  jls_codec<charls::default_traits<unsigned_short,charls::triplet<unsigned_short>>,charls::decoder_strategy>
  ::decode_run_pixels();
LAB_00115fc8:
  __assert_fail("index <= pixel_count",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,0x2d2,
                "int32_t charls::jls_codec<charls::default_traits<unsigned short, charls::triplet<unsigned short>>, charls::decoder_strategy>::decode_run_pixels(pixel_type, pixel_type *, const int32_t) [Traits = charls::default_traits<unsigned short, charls::triplet<unsigned short>>, Strategy = charls::decoder_strategy]"
               );
}

Assistant:

int32_t decode_run_pixels(pixel_type ra, pixel_type* start_pos, const int32_t pixel_count)
    {
        int32_t index{};
        while (Strategy::read_bit())
        {
            const int count{std::min(1 << J[run_index_], pixel_count - index)};
            index += count;
            ASSERT(index <= pixel_count);

            if (count == (1 << J[run_index_]))
            {
                increment_run_index();
            }

            if (index == pixel_count)
                break;
        }

        if (index != pixel_count)
        {
            // incomplete run.
            index += (J[run_index_] > 0) ? Strategy::read_value(J[run_index_]) : 0;
        }

        if (UNLIKELY(index > pixel_count))
            impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);

        for (int32_t i{}; i < index; ++i)
        {
            start_pos[i] = ra;
        }

        return index;
    }